

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::add_candidate_id
          (parameter_trie *this,parameter_cla_id *param_id,basic_param_ptr *param_candidate,
          bool final)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  byte in_CL;
  parameter_cla_id *in_RSI;
  long in_RDI;
  basic_cstring<const_char> *in_stack_fffffffffffffe10;
  cstring *in_stack_fffffffffffffe18;
  shared_ptr<boost::runtime::basic_param> *r;
  shared_ptr<boost::runtime::basic_param> *in_stack_fffffffffffffe20;
  conflicting_param *this_00;
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error>
  *in_stack_fffffffffffffe68;
  shared_ptr<boost::runtime::basic_param> local_18;
  shared_ptr<boost::runtime::basic_param> *local_8;
  
  if (((*(byte *)(in_RDI + 0x58) & 1) == 0) &&
     (((in_CL & 1) == 0 ||
      (bVar1 = std::
               vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
               ::empty((vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                        *)in_stack_fffffffffffffe20), bVar1)))) {
    *(byte *)(in_RDI + 0x58) = in_CL & 1;
    r = &local_18;
    local_8 = r;
    peVar2 = (element_type *)addressof<boost::runtime::parameter_cla_id_const>(in_RSI);
    r->px = peVar2;
    std::
    vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
    ::push_back((vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                 *)in_stack_fffffffffffffe20,(value_type *)r);
    sVar3 = std::
            vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
            ::size((vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                    *)(in_RDI + 0x30));
    if (sVar3 == 1) {
      shared_ptr<boost::runtime::basic_param>::operator=(in_stack_fffffffffffffe20,r);
    }
    else {
      shared_ptr<boost::runtime::basic_param>::reset(in_stack_fffffffffffffe20);
    }
    return;
  }
  this_00 = (conflicting_param *)&stack0xfffffffffffffe58;
  unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe10);
  this_01 = (specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error> *)
            &stack0xfffffffffffffe68;
  conflicting_param::conflicting_param(this_00,in_stack_fffffffffffffe18);
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error>::operator<<
            (this_01,(char *)this_00);
  specific_param_error<boost::runtime::conflicting_param,boost::runtime::init_error>::operator<<
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error>::operator<<
            (this_01,(char *)this_00);
  specific_param_error<boost::runtime::conflicting_param,_boost::runtime::init_error>::operator<<
            (this_01,(char *)this_00);
  std::
  vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
  ::back((vector<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
          *)in_stack_fffffffffffffe10);
  specific_param_error<boost::runtime::conflicting_param,boost::runtime::init_error>::operator<<
            (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  unit_test::ut_detail::throw_exception<boost::runtime::conflicting_param>(this_00);
}

Assistant:

void                add_candidate_id( parameter_cla_id const& param_id, basic_param_ptr param_candidate, bool final )
    {
        BOOST_TEST_I_ASSRT( !m_has_final_candidate && (!final || m_id_candidates.empty()),
          conflicting_param() << "Parameter cla id " << param_id.m_tag << " conflicts with the "
                              << "parameter cla id " << m_id_candidates.back().get().m_tag );

        m_has_final_candidate = final;
        m_id_candidates.push_back( ref(param_id) );

        if( m_id_candidates.size() == 1 )
            m_param_candidate = param_candidate;
        else
            m_param_candidate.reset();
    }